

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

Uint32 anon_unknown.dwarf_12a29d3::MachineRunner::sdl_callback(Uint32 param_1,void *param)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  long *plVar4;
  long *plVar5;
  long lVar6;
  unique_lock<std::mutex> lock_guard;
  ScanStatus local_58;
  
  if (*(int *)((long)param + 0x2c) != 0) {
    LOCK();
    *(undefined4 *)((long)param + 0x2c) = 2;
    UNLOCK();
    return 4;
  }
  lVar3 = std::chrono::_V2::system_clock::now();
  if (500000000 < lVar3 - *(long *)((long)param + 0x18)) {
    *(long *)((long)param + 0x18) = lVar3 + -500000000;
  }
  lVar6 = *(long *)((long)param + 0x20);
  std::unique_lock<std::mutex>::unique_lock(&lock_guard,*param);
  plVar4 = (long *)(**(code **)(**(long **)((long)param + 8) + 0x28))();
  plVar5 = (long *)(**(code **)(**(long **)((long)param + 8) + 0x20))();
  if ((lVar6 <= lVar3) && (*(long *)((long)param + 0x18) < lVar6)) {
    (**(code **)(*plVar4 + 8))(&local_58,plVar4);
    bVar2 = Time::ScanSynchroniser::can_synchronise
                      ((ScanSynchroniser *)((long)param + 0x30),&local_58,
                       *(double *)((long)param + 0x158));
    if (bVar2) {
      (**(code **)*plVar5)((double)(lVar6 - *(long *)((long)param + 0x18)) / 1000000000.0,plVar5);
      (**(code **)(*plVar5 + 0x28))(plVar5,3);
      (**(code **)(*plVar4 + 8))(&local_58,plVar4);
      Time::ScanSynchroniser::next_speed_multiplier
                ((ScanSynchroniser *)((long)param + 0x30),&local_58);
      (**(code **)(*plVar5 + 8))(plVar5);
      std::unique_lock<std::mutex>::unlock(&lock_guard);
      do {
        LOCK();
        cVar1 = *(char *)((long)param + 0x28);
        *(char *)((long)param + 0x28) = '\x01';
        UNLOCK();
      } while (cVar1 != '\0');
      std::unique_lock<std::mutex>::lock(&lock_guard);
      goto LAB_003f61e6;
    }
  }
  (**(code **)(*plVar5 + 8))(*(undefined8 *)((long)param + 0x38),plVar5);
  lVar6 = *(long *)((long)param + 0x18);
LAB_003f61e6:
  (**(code **)*plVar5)((double)(lVar3 - lVar6) / 1000000000.0,plVar5);
  (**(code **)(*plVar5 + 0x28))(plVar5,3);
  *(long *)((long)param + 0x18) = lVar3;
  std::unique_lock<std::mutex>::~unique_lock(&lock_guard);
  return 4;
}

Assistant:

static Uint32 sdl_callback(Uint32, void *param) {
			reinterpret_cast<MachineRunner *>(param)->update();
			return timer_period;
		}